

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocess.cpp
# Opt level: O1

int main(void)

{
  test_location<void_(*)()> test;
  test_location<void_(*)()> test_00;
  test_location<void_(*)()> test_01;
  test_location<void_(*)()> test_02;
  test_location<void_(*)()> test_03;
  test local_c0;
  code *local_88;
  char *pcStack_80;
  undefined4 local_78;
  undefined4 uStack_74;
  code *local_70;
  char *pcStack_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  code *local_58;
  char *pcStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  code *local_40;
  char *pcStack_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  code *local_28;
  char *pcStack_20;
  undefined4 local_18;
  undefined4 uStack_14;
  
  local_28 = main::anon_class_1_0_00000001::__invoke;
  pcStack_20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/preprocess.cpp";
  local_18 = 0x30;
  local_c0.type.data_ = "test";
  local_c0.type.size_ = 4;
  local_c0.name.data_ = "test_bqp_clean";
  local_c0.name.size_ = 0xe;
  local_c0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test.location._12_4_ = uStack_14;
  test.location.line_ = 0x30;
  test.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/preprocess.cpp"
  ;
  test.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_c0,test);
  if (local_c0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_40 = main::anon_class_1_0_00000001::__invoke;
  pcStack_38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/preprocess.cpp";
  local_30 = 0xc3;
  local_c0.type.data_ = "test";
  local_c0.type.size_ = 4;
  local_c0.name.data_ = "test_bound_affectation";
  local_c0.name.size_ = 0x16;
  local_c0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_00.location._12_4_ = uStack_2c;
  test_00.location.line_ = 0xc3;
  test_00.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/preprocess.cpp"
  ;
  test_00.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_c0,test_00);
  if (local_c0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_58 = main::anon_class_1_0_00000001::__invoke;
  pcStack_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/preprocess.cpp";
  local_48 = 0xec;
  local_c0.type.data_ = "test";
  local_c0.type.size_ = 4;
  local_c0.name.data_ = "test_cleaning_affected_variables";
  local_c0.name.size_ = 0x20;
  local_c0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_01.location._12_4_ = uStack_44;
  test_01.location.line_ = 0xec;
  test_01.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/preprocess.cpp"
  ;
  test_01.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_c0,test_01);
  if (local_c0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_70 = main::anon_class_1_0_00000001::__invoke;
  pcStack_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/preprocess.cpp";
  local_60 = 0xf9;
  local_c0.type.data_ = "test";
  local_c0.type.size_ = 4;
  local_c0.name.data_ = "test_affect_variable";
  local_c0.name.size_ = 0x14;
  local_c0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_02.location._12_4_ = uStack_5c;
  test_02.location.line_ = 0xf9;
  test_02.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/preprocess.cpp"
  ;
  test_02.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_c0,test_02);
  if (local_c0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_88 = main::anon_class_1_0_00000001::__invoke;
  pcStack_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/preprocess.cpp";
  local_78 = 300;
  local_c0.type.data_ = "test";
  local_c0.type.size_ = 4;
  local_c0.name.data_ = "test_split";
  local_c0.name.size_ = 10;
  local_c0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_03.location._12_4_ = uStack_74;
  test_03.location.line_ = 300;
  test_03.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/preprocess.cpp"
  ;
  test_03.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_c0,test_03);
  if (local_c0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int
main()
{
    using namespace boost::ut;

    "test_bqp_clean"_test = [] {
        auto ctx = baryonyx::make_context(4);

        {
            const char* str_pb = "minimize\n"
                                 "-5a + [ 2a * b + 6c * d ] /2 + 10b\n"
                                 "Subject to:\n"
                                 "- a + b >= 0\n"
                                 "b + c - d >= 0\n"
                                 "Binaries\n"
                                 "a b c d\n"
                                 "End\n";

            std::istringstream iss(str_pb);
            auto pb = baryonyx::make_problem(*ctx, iss);
            expect(pb);

            auto pb_pp = baryonyx::preprocess(*ctx, pb);

            expect(pb_pp.vars.names.size() == 4u);
            expect(pb_pp.affected_vars.names.size() == 0u);
            expect(pb_pp.equal_constraints.size() == 0u);
            expect(pb_pp.less_constraints.size() == 0u);
            expect(pb_pp.greater_constraints.size() == 2u);

            auto ida = get_variable(pb.vars.names, "a");
            auto idb = get_variable(pb.vars.names, "b");
            auto idc = get_variable(pb.vars.names, "c");
            auto idd = get_variable(pb.vars.names, "d");

            expect(ida >= 0 && ida < baryonyx::length(pb.vars.names));
            expect(idb >= 0 && idb < baryonyx::length(pb.vars.names));
            expect(idc >= 0 && idc < baryonyx::length(pb.vars.names));
            expect(idd >= 0 && idd < baryonyx::length(pb.vars.names));

            expect(pb_pp.objective.elements.size() == 2u);
            expect(pb_pp.objective.elements[0].variable_index == ida);
            expect(pb_pp.objective.elements[0].factor == -5);
            expect(pb_pp.objective.elements[1].variable_index == idb);
            expect(pb_pp.objective.elements[1].factor == 10);

            expect(pb_pp.objective.qelements.size() == 2u);
            expect(pb_pp.objective.qelements[0].variable_index_a == ida);
            expect(pb_pp.objective.qelements[0].variable_index_b == idb);
            expect(pb_pp.objective.qelements[0].factor == 1);
            expect(pb_pp.objective.qelements[1].variable_index_a == idc);
            expect(pb_pp.objective.qelements[1].variable_index_b == idd);
            expect(pb_pp.objective.qelements[1].factor == 3);
        }

        {
            const char* str_pb = "minimize\n"
                                 "-5a + [ 2a * b + 6c * d ] /2 + 10b\n"
                                 "Subject to:\n"
                                 "- a + b >= 0\n"
                                 "b + c - d >= 0\n"
                                 "Binaries\n"
                                 "a b c d\n"
                                 "End\n";

            std::istringstream iss(str_pb);
            auto pb = baryonyx::make_problem(*ctx, iss);
            expect(pb);

            auto pb_pp = baryonyx::preprocess(*ctx, pb);

            expect(pb_pp.vars.names.size() == 4u);
            expect(pb_pp.affected_vars.names.size() == 0u);
            expect(pb_pp.equal_constraints.size() == 0u);
            expect(pb_pp.less_constraints.size() == 0u);
            expect(pb_pp.greater_constraints.size() == 2u);

            auto ida = get_variable(pb.vars.names, "a");
            auto idb = get_variable(pb.vars.names, "b");
            auto idc = get_variable(pb.vars.names, "c");
            auto idd = get_variable(pb.vars.names, "d");

            expect(ida >= 0 && ida < baryonyx::length(pb.vars.names));
            expect(idb >= 0 && idb < baryonyx::length(pb.vars.names));
            expect(idc >= 0 && idc < baryonyx::length(pb.vars.names));
            expect(idd >= 0 && idd < baryonyx::length(pb.vars.names));

            expect(pb_pp.objective.elements.size() == 2u);
            expect(pb_pp.objective.elements[0].variable_index == ida);
            expect(pb_pp.objective.elements[0].factor == -5);
            expect(pb_pp.objective.elements[1].variable_index == idb);
            expect(pb_pp.objective.elements[1].factor == 10);

            expect(pb_pp.objective.qelements.size() == 2u);
            expect(pb_pp.objective.qelements[0].variable_index_a == ida);
            expect(pb_pp.objective.qelements[0].variable_index_b == idb);
            expect(pb_pp.objective.qelements[0].factor == 1);
            expect(pb_pp.objective.qelements[1].variable_index_a == idc);
            expect(pb_pp.objective.qelements[1].variable_index_b == idd);
            expect(pb_pp.objective.qelements[1].factor == 3);
        }

        {
            const char* str_pb =
              "minimize\n"
              "-5a + 10a + [ 2a * b + 6c * d ] /2 + 10b - b -b "
              "-b + [2 a * b + 6 c * d] / 2\n"
              "Subject to:\n"
              "- a + b >= 0\n"
              "b + c - d >= 0\n"
              "Binaries\n"
              "a b c d\n"
              "End\n";

            std::istringstream iss(str_pb);
            auto pb = baryonyx::make_problem(*ctx, iss);
            expect(pb);

            auto pb_pp = baryonyx::preprocess(*ctx, pb);

            expect(pb_pp.vars.names.size() == 4u);
            expect(pb_pp.affected_vars.names.size() == 0u);
            expect(pb_pp.equal_constraints.size() == 0u);
            expect(pb_pp.less_constraints.size() == 0u);
            expect(pb_pp.greater_constraints.size() == 2u);

            auto ida = get_variable(pb.vars.names, "a");
            auto idb = get_variable(pb.vars.names, "b");
            auto idc = get_variable(pb.vars.names, "c");
            auto idd = get_variable(pb.vars.names, "d");

            expect(ida >= 0 && ida < baryonyx::length(pb.vars.names));
            expect(idb >= 0 && idb < baryonyx::length(pb.vars.names));
            expect(idc >= 0 && idc < baryonyx::length(pb.vars.names));
            expect(idd >= 0 && idd < baryonyx::length(pb.vars.names));

            expect(pb_pp.objective.elements.size() == 2u);
            expect(pb_pp.objective.elements[0].variable_index == ida);
            expect(pb_pp.objective.elements[0].factor == 5);
            expect(pb_pp.objective.elements[1].variable_index == idb);
            expect(pb_pp.objective.elements[1].factor == 7);

            expect(pb_pp.objective.qelements.size() == 2u);
            expect(pb_pp.objective.qelements[0].variable_index_a == ida);
            expect(pb_pp.objective.qelements[0].variable_index_b == idb);
            expect(pb_pp.objective.qelements[0].factor == 2);
            expect(pb_pp.objective.qelements[1].variable_index_a == idc);
            expect(pb_pp.objective.qelements[1].variable_index_b == idd);
            expect(pb_pp.objective.qelements[1].factor == 6);
        }
    };

    "test_bound_affectation"_test = [] {
        auto ctx = baryonyx::make_context(4);

        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/bound.lp");

        expect(pb);
        expect(pb.vars.names.size() == static_cast<size_t>(6));

        // The preprocessing can not remove any constraint or variable from the
        // raw_problem.

        auto pb_pp = baryonyx::preprocess(*ctx, pb);
        expect(pb_pp.vars.names.size() == static_cast<size_t>(6));
        expect(pb_pp.affected_vars.names.size() == static_cast<size_t>(0));
        expect(pb_pp.equal_constraints.size() == static_cast<size_t>(0));
        expect(pb_pp.less_constraints.size() == static_cast<size_t>(2));
        expect(pb_pp.greater_constraints.size() == static_cast<size_t>(0));

        // We add an "affectation bound" for the variable 'f' i.e. in bound
        // section of the lp file format:
        //
        // bounds:
        // f = 0

        auto id = get_variable(pb.vars.names, "f");
        expect(id >= 0);
        expect(id < baryonyx::length(pb.vars.names));

        expect(pb.vars.names.size() == pb.vars.values.size());

        pb.vars.values[id].min = 0;
        pb.vars.values[id].max = 0;

        auto pb_pp2 = baryonyx::preprocess(*ctx, pb);
        expect(pb_pp2.vars.names.size() == static_cast<size_t>(5));
        expect(pb_pp2.affected_vars.names.size() == static_cast<size_t>(1));
        expect(pb_pp2.equal_constraints.size() == static_cast<size_t>(0));
        expect(pb_pp2.less_constraints.size() == static_cast<size_t>(2));
        expect(pb_pp2.greater_constraints.size() == static_cast<size_t>(0));
    };

    "test_cleaning_affected_variables"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/prepro.lp");

        expect(pb);
        expect(pb.vars.names.size() == static_cast<size_t>(23));

        auto pb_pp = baryonyx::preprocess(*ctx, pb);

        expect(pb_pp.vars.names.size() == static_cast<size_t>(2));
        expect(pb_pp.affected_vars.names.size() == static_cast<size_t>(21));
    };

    "test_affect_variable"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/prepro.lp");

        expect(pb);
        auto pb_pp = baryonyx::preprocess(*ctx, pb);

        expect(pb_pp.vars.names.size() == static_cast<size_t>(2));
        expect(pb_pp.affected_vars.names.size() == static_cast<size_t>(21));

        {
            // + d + e <= 1
            // d = 1 implies e = 0

            auto pb_af = baryonyx::affect(*ctx, pb_pp, 0, true);
            expect(pb_af.vars.names.size() == static_cast<size_t>(0));
            expect(pb_af.affected_vars.names.size() ==
                   static_cast<size_t>(23));
        }

        {
            // + d + e <= 1
            // d = 0 implies e = {0, 1} but minimize so => 0.

            auto pb_af = baryonyx::affect(*ctx, pb_pp, 0, false);
            expect(pb_af.vars.names.size() == static_cast<size_t>(0));
            expect(pb_af.affected_vars.names.size() ==
                   static_cast<size_t>(23));
        }

        {
            // + d + e <= 1
            // e = 1 implies d = 0

            auto pb_af = baryonyx::affect(*ctx, pb_pp, 1, true);
            expect(pb_af.vars.names.size() == static_cast<size_t>(0));
            expect(pb_af.affected_vars.names.size() ==
                   static_cast<size_t>(23));
        }

        {
            // + d + e <= 1
            // e = 0 implies d = {0, 1} but minimize so => 0.

            auto pb_af = baryonyx::affect(*ctx, pb_pp, 1, false);
            expect(pb_af.vars.names.size() == static_cast<size_t>(0));
            expect(pb_af.affected_vars.names.size() ==
                   static_cast<size_t>(23));
        }
    };

    "test_split"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/prepro.lp");
        expect(pb);
        auto pb_pp = baryonyx::preprocess(*ctx, pb);

        expect(pb_pp.vars.names.size() == static_cast<size_t>(2));
        expect(pb_pp.affected_vars.names.size() == static_cast<size_t>(21));

        baryonyx::problem p0, p1;
        std::tie(p0, p1) = baryonyx::split(*ctx, pb_pp, 0);

        {
            // + d + e <= 1
            // d = 1 implies e = 0

            expect(p0.vars.names.size() == static_cast<size_t>(0));
            expect(p0.affected_vars.names.size() == static_cast<size_t>(23));
        }

        {
            // + d + e <= 1
            // d = 0 implies e = {0, 1}

            expect(p1.vars.names.size() == static_cast<size_t>(0));
            expect(p1.affected_vars.names.size() == static_cast<size_t>(23));
        }
    };
}